

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O0

void ON_Internal_RecordErrorEvent(ON_ErrorEvent *error_event,bool bPrint)

{
  bool bVar1;
  char *sErrorMessage;
  int local_74;
  undefined1 local_70 [4];
  int obsolete_type;
  undefined1 local_50 [48];
  ON_String local_20;
  ON_String s;
  Type error_type;
  bool bPrint_local;
  ON_ErrorEvent *error_event_local;
  
  s.m_s._7_1_ = bPrint;
  if (ON_ACTIVE_ERROR_LOG != (ON_ErrorLog *)0x0) {
    (*ON_ACTIVE_ERROR_LOG->_vptr_ON_ErrorLog[2])(ON_ACTIVE_ERROR_LOG,error_event);
  }
  if ((ON_DEBUG_ERROR_MESSAGE_OPTION != 0) && ((s.m_s._7_1_ & 1) != 0)) {
    s.m_s._6_1_ = ON_ErrorEvent::EventType(error_event);
    ON_String::ON_String(&local_20);
    if (s.m_s._6_1_ == Warning) {
      if (ON_WARNING_COUNT == 0x20) {
        ON_String::FormatToString
                  (local_50 + 0x28,"ON_WARNING # %d: ... suspending warning messages.",0x20);
        ON_String::operator=(&local_20,(ON_String *)(local_50 + 0x28));
        ON_String::~ON_String((ON_String *)(local_50 + 0x28));
      }
      else {
        ON_String::FormatToString(local_50 + 8,"ON_WARNING # %d: ",(ulong)(uint)ON_WARNING_COUNT);
        ON_ErrorEvent::ToString((ON_ErrorEvent *)local_50);
        ON_String::operator+((ON_String *)(local_50 + 0x10),(ON_String *)(local_50 + 8));
        ON_String::operator=(&local_20,(ON_String *)(local_50 + 0x10));
        ON_String::~ON_String((ON_String *)(local_50 + 0x10));
        ON_String::~ON_String((ON_String *)local_50);
        ON_String::~ON_String((ON_String *)(local_50 + 8));
      }
    }
    else if (ON_ERROR_COUNT == 0x20) {
      ON_String::FormatToString
                (&stack0xffffffffffffffa8,"ON_ERROR # %d: ... suspending error messages.",0x20);
      ON_String::operator=(&local_20,(ON_String *)&stack0xffffffffffffffa8);
      ON_String::~ON_String((ON_String *)&stack0xffffffffffffffa8);
    }
    else {
      ON_String::FormatToString
                (&stack0xffffffffffffff98,"ON_ERROR # %d: ",(ulong)(uint)ON_ERROR_COUNT);
      ON_ErrorEvent::ToString((ON_ErrorEvent *)local_70);
      ON_String::operator+
                ((ON_String *)&stack0xffffffffffffffa0,(ON_String *)&stack0xffffffffffffff98);
      ON_String::operator=(&local_20,(ON_String *)&stack0xffffffffffffffa0);
      ON_String::~ON_String((ON_String *)&stack0xffffffffffffffa0);
      ON_String::~ON_String((ON_String *)local_70);
      ON_String::~ON_String((ON_String *)&stack0xffffffffffffff98);
    }
    bVar1 = ON_String::IsNotEmpty(&local_20);
    if (bVar1) {
      switch(s.m_s._6_1_) {
      case Unset:
        local_74 = 0;
        break;
      case Warning:
        local_74 = 0;
        break;
      case Error:
        local_74 = 1;
        break;
      case Assert:
        local_74 = 2;
        break;
      case Custom:
        local_74 = 0;
        break;
      case SubDError:
        local_74 = 0;
        break;
      default:
        local_74 = 0;
        break;
      case NotValid:
        local_74 = 0;
      }
      sErrorMessage = ON_String::operator_cast_to_char_(&local_20);
      ON_ErrorMessage(local_74,sErrorMessage);
    }
    ON_String::~ON_String(&local_20);
  }
  return;
}

Assistant:

static void ON_Internal_RecordErrorEvent(
  const ON_ErrorEvent& error_event,
  bool bPrint
  )
{
  if (nullptr != ON_ACTIVE_ERROR_LOG)
    ON_ACTIVE_ERROR_LOG->Append(error_event);


  if ( 0 == ON_DEBUG_ERROR_MESSAGE_OPTION )
    return;

  if (false == bPrint)
    return;

  
  const ON_ErrorEvent::Type error_type = error_event.EventType();
  ON_String s;      
  if ( ON_ErrorEvent::Type::Warning == error_type )
  {
    if (ON_WARNING_COUNT == ON_MAX_ERROR_MESSAGE_COUNT)
      s = ON_String::FormatToString("ON_WARNING # %d: ... suspending warning messages.", ON_WARNING_COUNT);
    else
      s = ON_String::FormatToString("ON_WARNING # %d: ", ON_WARNING_COUNT) + error_event.ToString();
  }
  else
  {
    if (ON_ERROR_COUNT == ON_MAX_ERROR_MESSAGE_COUNT)
      s = ON_String::FormatToString("ON_ERROR # %d: ... suspending error messages.", ON_ERROR_COUNT);
    else
      s = ON_String::FormatToString("ON_ERROR # %d: ", ON_ERROR_COUNT) + error_event.ToString();
  }

  if ( s.IsNotEmpty() )
  {
    int obsolete_type;
    switch (error_type)
    {
    case ON_ErrorEvent::Type::Unset:
      obsolete_type = 0;
      break;
    case ON_ErrorEvent::Type::Warning:
      obsolete_type = 0;
      break;
    case ON_ErrorEvent::Type::Error:
      obsolete_type = 1;
      break;
    case ON_ErrorEvent::Type::Assert:
      obsolete_type = 2;
      break;
    case ON_ErrorEvent::Type::Custom:
      obsolete_type = 0;
      break;
    case ON_ErrorEvent::Type::SubDError:
      obsolete_type = 0;
      break;
    case ON_ErrorEvent::Type::NotValid:
      obsolete_type = 0;
      break;
    default:
      obsolete_type = 0;
      break;
    }
    ON_ErrorMessage(obsolete_type,static_cast<const char*>(s));
  }
}